

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O3

QSharedPointer<QColorDialogOptions> QColorDialogOptions::create(void)

{
  QColorDialogOptionsPrivate *pQVar1;
  Data *extraout_RDX;
  totally_ordered_wrapper<QColorDialogOptions_*> in_RDI;
  QSharedPointer<QColorDialogOptions> QVar2;
  
  pQVar1 = (QColorDialogOptionsPrivate *)operator_new(0x38);
  *(undefined4 *)&pQVar1->field_0x4 = 1;
  (pQVar1->options).super_QFlagsStorageHelper<QColorDialogOptions::ColorDialogOption,_4>.
  super_QFlagsStorage<QColorDialogOptions::ColorDialogOption>.i = 1;
  *(undefined8 *)(pQVar1 + 1) = 0;
  pQVar1[1].windowTitle.d.d = (Data *)0x0;
  (pQVar1->windowTitle).d.ptr = (char16_t *)0x0;
  (pQVar1->windowTitle).d.size = 0;
  pQVar1[1].windowTitle.d.ptr = (char16_t *)&(pQVar1->windowTitle).d.ptr;
  (pQVar1->windowTitle).d.d =
       (Data *)QtSharedPointer::
               ExternalRefCountWithContiguousData<(anonymous_namespace)::ColorDialogCombined>::
               deleter;
  (in_RDI.ptr)->d = (QColorDialogOptionsPrivate *)&pQVar1[1].windowTitle.d.ptr;
  in_RDI.ptr[1].d = pQVar1;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined>::~QSharedPointer
            ((QSharedPointer<(anonymous_namespace)::ColorDialogCombined> *)0x0);
  QVar2.d = extraout_RDX;
  QVar2.value.ptr = in_RDI.ptr;
  return QVar2;
}

Assistant:

QSharedPointer<QColorDialogOptions> QColorDialogOptions::create()
{
    return QSharedPointer<ColorDialogCombined>::create();
}